

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

void __thiscall IF97::Region3::Region3(Region3 *this)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  ulong local_48;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  ulong local_18;
  size_t i;
  Region3 *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->Ir);
  std::vector<int,_std::allocator<int>_>::vector(&this->Jr);
  std::vector<double,_std::allocator<double>_>::vector(&this->nr);
  std::vector<int,_std::allocator<int>_>::vector(&this->muJ0);
  std::vector<double,_std::allocator<double>_>::vector(&this->mun0);
  std::vector<int,_std::allocator<int>_>::vector(&this->muIr);
  std::vector<int,_std::allocator<int>_>::vector(&this->muJr);
  std::vector<double,_std::allocator<double>_>::vector(&this->munr);
  std::vector<int,_std::allocator<int>_>::vector(&this->lamJ0);
  std::vector<double,_std::allocator<double>_>::vector(&this->lamn0);
  std::vector<int,_std::allocator<int>_>::vector(&this->lamIr);
  std::vector<int,_std::allocator<int>_>::vector(&this->lamJr);
  std::vector<double,_std::allocator<double>_>::vector(&this->lamnr);
  this->T_star = 1000.0;
  this->p_star = 1.0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::size
                      ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                       reg3rdata);
    if (sVar1 <= local_18) break;
    pvVar2 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::operator[]
                       ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                        reg3rdata,local_18);
    std::vector<double,_std::allocator<double>_>::push_back(&this->nr,&pvVar2->n);
    pvVar2 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::operator[]
                       ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                        reg3rdata,local_18);
    std::vector<int,_std::allocator<int>_>::push_back(&this->Ir,&pvVar2->I);
    pvVar2 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::operator[]
                       ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                        reg3rdata,local_18);
    std::vector<int,_std::allocator<int>_>::push_back(&this->Jr,&pvVar2->J);
    local_18 = local_18 + 1;
  }
  i_2 = 0;
  while( true ) {
    sVar1 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::size
                      ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                       Hrdata);
    if (sVar1 <= i_2) break;
    pvVar2 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::operator[]
                       ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                        Hrdata,i_2);
    std::vector<double,_std::allocator<double>_>::push_back(&this->munr,&pvVar2->n);
    pvVar2 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::operator[]
                       ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                        Hrdata,i_2);
    std::vector<int,_std::allocator<int>_>::push_back(&this->muIr,&pvVar2->I);
    pvVar2 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::operator[]
                       ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                        Hrdata,i_2);
    std::vector<int,_std::allocator<int>_>::push_back(&this->muJr,&pvVar2->J);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    sVar1 = std::vector<RegionIdealElement,_std::allocator<RegionIdealElement>_>::size
                      ((vector<RegionIdealElement,_std::allocator<RegionIdealElement>_> *)H0data);
    if (sVar1 <= i_3) break;
    pvVar3 = std::vector<RegionIdealElement,_std::allocator<RegionIdealElement>_>::operator[]
                       ((vector<RegionIdealElement,_std::allocator<RegionIdealElement>_> *)H0data,
                        i_3);
    std::vector<double,_std::allocator<double>_>::push_back(&this->mun0,&pvVar3->n);
    pvVar3 = std::vector<RegionIdealElement,_std::allocator<RegionIdealElement>_>::operator[]
                       ((vector<RegionIdealElement,_std::allocator<RegionIdealElement>_> *)H0data,
                        i_3);
    std::vector<int,_std::allocator<int>_>::push_back(&this->muJ0,&pvVar3->J);
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    sVar1 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::size
                      ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                       Lrdata);
    if (sVar1 <= i_4) break;
    pvVar2 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::operator[]
                       ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                        Lrdata,i_4);
    std::vector<double,_std::allocator<double>_>::push_back(&this->lamnr,&pvVar2->n);
    pvVar2 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::operator[]
                       ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                        Lrdata,i_4);
    std::vector<int,_std::allocator<int>_>::push_back(&this->lamIr,&pvVar2->I);
    pvVar2 = std::vector<RegionResidualElement,_std::allocator<RegionResidualElement>_>::operator[]
                       ((vector<RegionResidualElement,_std::allocator<RegionResidualElement>_> *)
                        Lrdata,i_4);
    std::vector<int,_std::allocator<int>_>::push_back(&this->lamJr,&pvVar2->J);
    i_4 = i_4 + 1;
  }
  local_48 = 0;
  while( true ) {
    sVar1 = std::vector<RegionIdealElement,_std::allocator<RegionIdealElement>_>::size
                      ((vector<RegionIdealElement,_std::allocator<RegionIdealElement>_> *)L0data);
    if (sVar1 <= local_48) break;
    pvVar3 = std::vector<RegionIdealElement,_std::allocator<RegionIdealElement>_>::operator[]
                       ((vector<RegionIdealElement,_std::allocator<RegionIdealElement>_> *)L0data,
                        local_48);
    std::vector<double,_std::allocator<double>_>::push_back(&this->lamn0,&pvVar3->n);
    pvVar3 = std::vector<RegionIdealElement,_std::allocator<RegionIdealElement>_>::operator[]
                       ((vector<RegionIdealElement,_std::allocator<RegionIdealElement>_> *)L0data,
                        local_48);
    std::vector<int,_std::allocator<int>_>::push_back(&this->lamJ0,&pvVar3->J);
    local_48 = local_48 + 1;
  }
  this->R = 0.461526;
  return;
}

Assistant:

Region3() : T_star(1000), p_star(1*p_fact) {
            for (std::size_t i = 0; i < reg3rdata.size(); ++i){
                nr.push_back(reg3rdata[i].n);
                Ir.push_back(reg3rdata[i].I);
                Jr.push_back(reg3rdata[i].J);
            }
            for (std::size_t i = 0; i < Hrdata.size(); ++i){
                munr.push_back(Hrdata[i].n);
                muIr.push_back(Hrdata[i].I);
                muJr.push_back(Hrdata[i].J);
            }
            for (std::size_t i = 0; i < H0data.size(); ++i){
                mun0.push_back(H0data[i].n);
                muJ0.push_back(H0data[i].J);
            }
            for (std::size_t i = 0; i < Lrdata.size(); ++i){
                lamnr.push_back(Lrdata[i].n);
                lamIr.push_back(Lrdata[i].I);
                lamJr.push_back(Lrdata[i].J);
            }
            for (std::size_t i = 0; i < L0data.size(); ++i){
                lamn0.push_back(L0data[i].n);
                lamJ0.push_back(L0data[i].J);
            }
            R = Rgas;
        }